

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype __thiscall
QtPrivate::lastIndexOf
          (QtPrivate *this,QStringView haystack,qsizetype from,char16_t needle,CaseSensitivity cs)

{
  bool bVar1;
  long lVar2;
  storage_type_conflict *psVar3;
  long lVar4;
  ushort uVar5;
  storage_type_conflict *psVar6;
  storage_type_conflict *psVar7;
  short sVar8;
  undefined6 in_register_00000082;
  ushort uVar9;
  
  uVar5 = (ushort)from;
  psVar6 = (storage_type_conflict *)haystack.m_size;
  psVar7 = haystack.m_data;
  if (psVar7 == (storage_type_conflict *)0x0) {
    return -1;
  }
  psVar3 = (storage_type_conflict *)((long)psVar7 - 1);
  if (psVar6 <= psVar7) {
    psVar3 = psVar6;
  }
  if ((long)psVar6 < 0) {
    psVar3 = (storage_type_conflict *)((long)psVar6 + (long)psVar7);
  }
  if ((long)psVar3 < 0) {
    return -1;
  }
  if ((int)CONCAT62(in_register_00000082,needle) == 1) {
    lVar4 = (long)psVar3 * 2;
    do {
      if (*(ushort *)(this + lVar4) == uVar5) goto LAB_00122e10;
      lVar2 = lVar4 + -2;
      lVar4 = lVar4 + -2;
    } while (this <= this + lVar2);
  }
  else {
    sVar8 = (short)((uint)(int)(short)*(ushort *)
                                       (QUnicodeTables::uc_properties +
                                       (ulong)*(ushort *)
                                               (QUnicodeTables::uc_property_trie +
                                               (ulong)(((uint)(from & 0xffffU) & 0x1f) +
                                                      (uint)*(ushort *)
                                                             (QUnicodeTables::uc_property_trie +
                                                             ((from & 0xffffU) >> 5) * 2)) * 2) *
                                       0x14 + 0xe) >> 1);
    if ((*(ushort *)
          (QUnicodeTables::uc_properties +
          (ulong)*(ushort *)
                  (QUnicodeTables::uc_property_trie +
                  (ulong)(((uint)(from & 0xffffU) & 0x1f) +
                         (uint)*(ushort *)
                                (QUnicodeTables::uc_property_trie + ((from & 0xffffU) >> 5) * 2)) *
                  2) * 0x14 + 0xe) & 1) == 0) {
      uVar5 = sVar8 + uVar5;
    }
    else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar8 * 2) == 1) {
      uVar5 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar8 * 2 + 2);
    }
    lVar4 = (long)psVar3 * 2;
    do {
      uVar9 = *(ushort *)(this + lVar4);
      sVar8 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)((uVar9 & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)(uVar9 >> 5) * 2)) * 2) * 0x14
                                         + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((uVar9 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie + (ulong)(uVar9 >> 5) * 2)) * 2)
            * 0x14 + 0xe) & 1) == 0) {
        uVar9 = sVar8 + uVar9;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar8 * 2) == 1) {
        uVar9 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar8 * 2 + 2);
      }
      if (uVar9 == uVar5) goto LAB_00122e10;
      lVar2 = lVar4 + -2;
      lVar4 = lVar4 + -2;
    } while (this <= this + lVar2);
  }
  bVar1 = true;
LAB_00122e15:
  if (bVar1) {
    return -1;
  }
  return lVar4;
LAB_00122e10:
  lVar4 = lVar4 >> 1;
  bVar1 = false;
  goto LAB_00122e15;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, char16_t needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, QChar(needle), from, cs);
}